

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::getHead(Term *t)

{
  bool bVar1;
  TermList *pTVar2;
  Term *in_RDI;
  TermList trm;
  Term *in_stack_ffffffffffffffe8;
  uint64_t local_8;
  
  Kernel::TermList::TermList((TermList *)in_RDI,in_stack_ffffffffffffffe8);
  while( true ) {
    bVar1 = Kernel::Term::isApplication(in_RDI);
    if (!bVar1) {
      return (TermList)local_8;
    }
    pTVar2 = Kernel::Term::nthArgument(in_RDI,2);
    local_8 = pTVar2->_content;
    bVar1 = Kernel::TermList::isTerm((TermList *)0x8414b9);
    if (!bVar1) break;
    Kernel::TermList::term((TermList *)0x8414c9);
    bVar1 = Kernel::Term::isSpecial((Term *)0x8414d1);
    if (bVar1) {
      return (TermList)local_8;
    }
    in_RDI = Kernel::TermList::term((TermList *)0x8414e3);
  }
  return (TermList)local_8;
}

Assistant:

TermList ApplicativeHelper::getHead(Term* t)
{
  TermList trm = TermList(t);
  while(t->isApplication()){
    trm = *t->nthArgument(2);
    if(!trm.isTerm() || trm.term()->isSpecial()){ break; }
    t = trm.term(); 
  }
  return trm;
}